

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
FxStackVariable::FxStackVariable(FxStackVariable *this,PType *type,int offset,FScriptPosition *pos)

{
  PField *this_00;
  size_t len;
  FName local_38 [4];
  FScriptPosition *local_28;
  FScriptPosition *pos_local;
  PType *pPStack_18;
  int offset_local;
  PType *type_local;
  FxStackVariable *this_local;
  
  len = 0x44;
  local_28 = pos;
  pos_local._4_4_ = offset;
  pPStack_18 = type;
  type_local = (PType *)this;
  FxExpression::FxExpression(&this->super_FxExpression,EFX_StackVariable,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxStackVariable_00a0af40;
  this_00 = (PField *)DObject::operator_new((DObject *)0x40,len);
  FName::FName(local_38,NAME_None);
  PField::PField(this_00,local_38,pPStack_18,0,(long)pos_local._4_4_,0);
  this->membervar = this_00;
  this->AddressRequested = false;
  this->AddressWritable = true;
  return;
}

Assistant:

FxStackVariable::FxStackVariable(PType *type, int offset, const FScriptPosition &pos)
	: FxExpression(EFX_StackVariable, pos)
{
	membervar = new PField(NAME_None, type, 0, offset);
	AddressRequested = false;
	AddressWritable = true;	// must be true unless classx tells us otherwise if requested.
}